

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

void __thiscall indk::Position::Position(Position *this,Position *P)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  
  this->Xm = P->Xm;
  uVar4 = (ulong)P->DimensionsCount;
  this->DimensionsCount = P->DimensionsCount;
  pfVar2 = (float *)operator_new__(uVar4 * 4);
  this->X = pfVar2;
  if (uVar4 != 0) {
    pfVar1 = P->X;
    uVar3 = 0;
    do {
      fVar5 = -1.0;
      if (uVar3 < uVar4) {
        fVar5 = pfVar1[uVar3];
      }
      pfVar2[uVar3] = fVar5;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

indk::Position::Position(const indk::Position &P) {
    Xm = P.getXm();
    DimensionsCount = P.getDimensionsCount();
    X = new float[DimensionsCount];
    for (unsigned int i = 0; i < DimensionsCount; i++) X[i] = P.getPositionValue(i);
}